

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmepoll.c
# Opt level: O1

void init_select_data(CMtrans_services_conflict svc,select_data_ptr *sdp,CManager cm)

{
  int iVar1;
  select_data_ptr psVar2;
  FunctionListElement *pFVar3;
  undefined8 local_30;
  
  psVar2 = (select_data_ptr)malloc(0x48);
  *sdp = psVar2;
  iVar1 = epoll_create(1);
  psVar2->epfd = iVar1;
  psVar2->server_thread = 0;
  psVar2->closed = 0;
  psVar2->sel_item_max = 0;
  pFVar3 = (FunctionListElement *)(*svc->malloc_func)(0x18);
  psVar2->select_items = pFVar3;
  pFVar3->func = (select_list_func)0x0;
  pFVar3->arg1 = (void *)0x0;
  pFVar3->arg2 = (void *)0x0;
  pFVar3 = (FunctionListElement *)(*svc->malloc_func)(0x18);
  psVar2->write_items = pFVar3;
  pFVar3->func = (select_list_func)0x0;
  pFVar3->arg1 = (void *)0x0;
  pFVar3->arg2 = (void *)0x0;
  psVar2->periodic_task_list = (periodic_task_handle_conflict)0x0;
  psVar2->select_consistency_number = 0;
  psVar2->wake_read_fd = -1;
  psVar2->wake_write_fd = -1;
  if (cm != (CManager)0x0) {
    psVar2->cm = cm;
  }
  psVar2 = *sdp;
  if (psVar2->cm != (CManager)0x0) {
    iVar1 = (*svc->return_CM_lock_status)
                      (psVar2->cm,
                       "/workspace/llm4binary/github/license_c_cmakelists/ornladios[P]ADIOS2/thirdparty/EVPath/EVPath/cmepoll.c"
                       ,0x3b2);
    if (iVar1 == 0) {
      printf("%s:%u: failed assertion `%s\'\n",
             "/workspace/llm4binary/github/license_c_cmakelists/ornladios[P]ADIOS2/thirdparty/EVPath/EVPath/cmepoll.c"
             ,0x3b2,"CM_LOCKED(svc, sd->cm)");
      abort();
    }
  }
  if (psVar2->wake_read_fd == -1) {
    iVar1 = pipe((int *)&local_30);
    if (iVar1 == 0) {
      psVar2->wake_read_fd = (undefined4)local_30;
      psVar2->wake_write_fd = local_30._4_4_;
      (*svc->verbose)(psVar2->cm,CMSelectVerbose,"CMSelect Adding read_wake_fd as action on fd %d");
      libcmepoll_LTX_add_select
                (svc,sdp,psVar2->wake_read_fd,read_wake_fd,(void *)(long)psVar2->wake_read_fd,
                 (void *)0x0);
    }
    else {
      perror("Pipe for wake not created.  Wake mechanism inoperative.");
    }
  }
  return;
}

Assistant:

static void
init_select_data(CMtrans_services svc, select_data_ptr *sdp, CManager cm)
{
    select_data_ptr sd = malloc(sizeof(struct select_data));
    *sdp = sd;
    sd->epfd = epoll_create(1);
    sd->server_thread =  (thr_thread_t) NULL;
    sd->closed = 0;
    sd->sel_item_max = 0;
    sd->select_items = (FunctionListElement *) svc->malloc_func(sizeof(FunctionListElement));
    sd->select_items[0].func = NULL;
    sd->select_items[0].arg1 = NULL;
    sd->select_items[0].arg2 = NULL;
    sd->write_items = (FunctionListElement *) svc->malloc_func(sizeof(FunctionListElement));
    sd->write_items[0].func = NULL;
    sd->write_items[0].arg1 = NULL;
    sd->write_items[0].arg2 = NULL;
    
    sd->periodic_task_list = NULL;
    sd->select_consistency_number = 0;
    sd->wake_read_fd = -1;
    sd->wake_write_fd = -1;
    if (cm != NULL) {
	sd->cm = cm;
    }
    setup_wake_mechanism(svc, sdp);
}